

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

bool __thiscall flatbuffers::JavaGRPCGenerator::generate(JavaGRPCGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ServiceDef *pSVar2;
  Namespace *this_00;
  SymbolTable<flatbuffers::ServiceDef> *pSVar3;
  bool bVar4;
  int iVar5;
  File *file_00;
  long *plVar6;
  long lVar7;
  long *plVar8;
  size_type *psVar9;
  Parameters *in_R8;
  string filename;
  string output;
  Parameters p;
  FlatBufFile file;
  bool local_101;
  long local_100;
  string local_f0;
  BaseGenerator *local_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  Service local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  string local_68;
  undefined **local_48;
  Parser *local_40;
  string *local_38;
  undefined4 local_30;
  
  local_40 = (this->super_BaseGenerator).parser_;
  local_38 = (this->super_BaseGenerator).file_name_;
  local_48 = &PTR__CommentHolder_003f42b8;
  local_30 = 2;
  local_88.super_CommentHolder._vptr_CommentHolder = (CommentHolder)&local_78;
  local_80 = 0;
  local_78 = 0;
  iVar5 = (int)((ulong)((long)(local_40->services_).vec.
                              super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_40->services_).vec.
                             super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_101 = iVar5 < 1;
  local_d0 = &this->super_BaseGenerator;
  if (0 < iVar5) {
    paVar1 = &local_f0.field_2;
    local_100 = 0;
    do {
      pSVar3 = &local_40->services_;
      file_00 = (File *)operator_new(0x10);
      pSVar2 = (pSVar3->vec).
               super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start[local_100];
      (file_00->super_CommentHolder)._vptr_CommentHolder =
           (_func_int **)&PTR__CommentHolder_003f4140;
      file_00[1].super_CommentHolder._vptr_CommentHolder = (_func_int **)pSVar2;
      pSVar2 = (local_d0->parser_->services_).vec.
               super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start[local_100];
      this_00 = (pSVar2->super_Definition).defined_namespace;
      local_f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
      Namespace::GetFullyQualifiedName(&local_a8,this_00,&local_f0,1000);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      grpc_java_generator::GenerateServiceSource_abi_cxx11_
                (&local_a8,(grpc_java_generator *)&local_48,file_00,&local_88,in_R8);
      BaseGenerator::NamespaceDir_abi_cxx11_
                (&local_68,local_d0,(pSVar2->super_Definition).defined_namespace,false);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_68,
                                  *(ulong *)&(pSVar2->super_Definition).name._M_dataplus);
      local_c8 = &local_b8;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_b8 = *plVar8;
        lStack_b0 = plVar6[3];
      }
      else {
        local_b8 = *plVar8;
        local_c8 = (long *)*plVar6;
      }
      local_c0 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_f0.field_2._M_allocated_capacity = *psVar9;
        local_f0.field_2._8_8_ = plVar6[3];
        local_f0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar9;
        local_f0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_f0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      bVar4 = SaveFile(local_f0._M_dataplus._M_p,local_a8._M_dataplus._M_p,local_a8._M_string_length
                       ,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      (*(file_00->super_CommentHolder)._vptr_CommentHolder[1])();
      if (!bVar4) break;
      local_100 = local_100 + 1;
      lVar7 = (long)(int)((ulong)((long)(local_40->services_).vec.
                                        super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_40->services_).vec.
                                       super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_101 = lVar7 <= local_100;
    } while (local_100 < lVar7);
  }
  if (local_88.super_CommentHolder._vptr_CommentHolder != (CommentHolder)&local_78) {
    operator_delete((void *)local_88.super_CommentHolder._vptr_CommentHolder,
                    CONCAT71(uStack_77,local_78) + 1);
  }
  return local_101;
}

Assistant:

bool generate() {
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageJava);
    grpc_java_generator::Parameters p;
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      const Definition *def = parser_.services_.vec[i];
      p.package_name =
          def->defined_namespace->GetFullyQualifiedName("");  // file.package();
      std::string output =
          grpc_java_generator::GenerateServiceSource(&file, service.get(), &p);
      std::string filename =
          NamespaceDir(*def->defined_namespace) + def->name + "Grpc.java";
      if (!flatbuffers::SaveFile(filename.c_str(), output, false)) return false;
    }
    return true;
  }